

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_joinref.cpp
# Opt level: O3

void duckdb::LogicalComparisonJoin::ExtractJoinConditions
               (ClientContext *context,JoinType type,JoinRefType ref_type,
               unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *left_child,
               unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *right_child,
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *left_bindings,
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *right_bindings,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *expressions,vector<duckdb::JoinCondition,_true> *conditions,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *arbitrary_expressions)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  undefined8 uVar3;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *this_00;
  JoinSide JVar4;
  JoinSide JVar5;
  bool bVar6;
  int iVar7;
  type pEVar8;
  pointer pEVar9;
  ulong uVar10;
  BoundComparisonExpression *pBVar11;
  pointer pLVar12;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> this_01;
  pointer this_02;
  LogicalFilter *pLVar13;
  undefined7 in_register_00000011;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var14;
  undefined7 in_register_00000031;
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  *pvVar15;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var16;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_03;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_04;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_f8;
  undefined4 local_f0;
  undefined4 local_ec;
  Value local_e8;
  ClientContext *local_a8;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_a0;
  type local_98;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_90;
  LogicalType local_88;
  Value local_70;
  
  local_ec = (undefined4)CONCAT71(in_register_00000011,ref_type);
  local_f0 = (undefined4)CONCAT71(in_register_00000031,type);
  this_03 = (expressions->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_90 = (expressions->
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (this_03 != local_90) {
    local_a8 = context;
    local_a0 = right_child;
    do {
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(this_03);
      JVar4 = JoinSide::GetJoinSide(pEVar8,left_bindings,right_bindings);
      this_00 = local_a0;
      pvVar15 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                 *)arbitrary_expressions;
      if (JVar4.value == BOTH) {
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_03);
        if ((((((((pEVar9->super_BaseExpression).type != COMPARE_BOUNDARY_START) &&
                (pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->(this_03),
                (pEVar9->super_BaseExpression).type != COMPARE_NOTEQUAL)) &&
               (pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator->(this_03),
               (pEVar9->super_BaseExpression).type != COMPARE_BOUNDARY_START)) &&
              ((pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator->(this_03),
               (pEVar9->super_BaseExpression).type != COMPARE_LESSTHAN &&
               (pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator->(this_03),
               (pEVar9->super_BaseExpression).type != COMPARE_GREATERTHAN)))) &&
             ((pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::operator->(this_03),
              (pEVar9->super_BaseExpression).type != COMPARE_LESSTHANOREQUALTO &&
              ((pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator->(this_03),
               (pEVar9->super_BaseExpression).type != COMPARE_GREATERTHANOREQUALTO &&
               (pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator->(this_03),
               (pEVar9->super_BaseExpression).type != COMPARE_BOUNDARY_START)))))) &&
            (pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(this_03),
            (pEVar9->super_BaseExpression).type != COMPARE_BOUNDARY_END)) &&
           (pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(this_03),
           (pEVar9->super_BaseExpression).type != COMPARE_DISTINCT_FROM)) goto LAB_011ec535;
        pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_03);
        if (((char)local_ec == '\x04') &&
           ((uVar10 = (ulong)(pEVar9->super_BaseExpression).type, 0x28 < uVar10 ||
            ((0x1007a000000U >> (uVar10 & 0x3f) & 1) == 0)))) goto LAB_011ec535;
        local_98 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator*(this_03);
        pBVar11 = BaseExpression::Cast<duckdb::BoundComparisonExpression>
                            (&local_98->super_BaseExpression);
        this = &pBVar11->left;
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(this);
        JVar4 = JoinSide::GetJoinSide(pEVar8,left_bindings,right_bindings);
        this_04 = &pBVar11->right;
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(this_04);
        JVar5 = JoinSide::GetJoinSide(pEVar8,left_bindings,right_bindings);
        if ((JVar4.value == BOTH) || (JVar5.value == BOTH)) goto LAB_011ec535;
        local_e8.type_._0_8_ = (LogicalOperator *)0x0;
        local_e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_1_ = (local_98->super_BaseExpression).type;
        _Var16._M_head_impl =
             (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
             _M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (this->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        _Var1._M_head_impl =
             (this_04->
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (this_04->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
        _Var14._M_head_impl = _Var1._M_head_impl;
        if (JVar4.value == RIGHT) {
          local_e8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _0_1_ = FlipComparisonExpression
                            ((ExpressionType)
                             local_e8.type_.type_info_.internal.
                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
          _Var14._M_head_impl = _Var16._M_head_impl;
          _Var16._M_head_impl = _Var1._M_head_impl;
        }
        local_e8.type_._0_8_ = _Var16._M_head_impl;
        local_e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)_Var14._M_head_impl;
        ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
        emplace_back<duckdb::JoinCondition>
                  (&conditions->
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                   (JoinCondition *)&local_e8);
        if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_e8.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
          (*((BaseExpression *)
            &(local_e8.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_ExtraTypeInfo)->_vptr_BaseExpression[1])();
        }
        local_e8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
            local_e8.type_._0_8_ != (Expression *)0x0) {
          (*((BaseExpression *)local_e8.type_._0_8_)->_vptr_BaseExpression[1])();
        }
      }
      else {
        if (ref_type == ASOF || type == LEFT) {
          if (JVar4.value == RIGHT) {
            pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      ::operator->(local_a0);
            if (pLVar12->type != LOGICAL_FILTER) {
              this_01.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                   (_Head_base<0UL,_duckdb::Expression_*,_false>)operator_new(0x80);
              LogicalFilter::LogicalFilter
                        ((LogicalFilter *)
                         this_01.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl);
              local_e8.type_._0_8_ =
                   this_01.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
              this_02 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                                      *)&local_e8);
              local_f8._M_head_impl =
                   (this_00->
                   super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                   .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
              (this_00->
              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                   (LogicalOperator *)0x0;
              LogicalOperator::AddChild
                        (&this_02->super_LogicalOperator,
                         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)&local_f8);
              if (local_f8._M_head_impl != (LogicalOperator *)0x0) {
                (*(local_f8._M_head_impl)->_vptr_LogicalOperator[1])();
              }
              uVar3 = local_e8.type_._0_8_;
              local_f8._M_head_impl = (LogicalOperator *)0x0;
              local_e8.type_._0_8_ = (Expression *)0x0;
              _Var2._M_head_impl =
                   (this_00->
                   super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   )._M_t.
                   super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                   .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
              (this_00->
              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                   (LogicalOperator *)uVar3;
              if ((_Var2._M_head_impl != (LogicalOperator *)0x0) &&
                 ((**(code **)((long)(_Var2._M_head_impl)->_vptr_LogicalOperator + 8))(),
                 (Expression *)local_e8.type_._0_8_ != (Expression *)0x0)) {
                (*((BaseExpression *)local_e8.type_._0_8_)->_vptr_BaseExpression[1])();
              }
            }
            pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      ::operator->(this_00);
            pLVar13 = LogicalOperator::Cast<duckdb::LogicalFilter>(pLVar12);
            pvVar15 = (vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                       *)&(pLVar13->super_LogicalOperator).expressions;
          }
          else if ((char)local_f0 == '\x01') {
            pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(this_03);
            iVar7 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar9);
            if ((char)iVar7 != '\0') {
              LogicalType::LogicalType(&local_88,SQLNULL);
              Value::Value(&local_e8,&local_88);
              LogicalType::~LogicalType(&local_88);
              pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       ::operator*(this_03);
              ExpressionExecutor::TryEvaluateScalar(local_a8,pEVar8,&local_e8);
              if (local_e8.is_null == true) {
                Value::~Value(&local_e8);
              }
              else {
                Value::Value(&local_70,true);
                bVar6 = Value::operator==(&local_e8,&local_70);
                Value::~Value(&local_70);
                Value::~Value(&local_e8);
                if (bVar6) goto LAB_011ec53d;
              }
            }
          }
        }
LAB_011ec535:
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  (pvVar15,this_03);
      }
LAB_011ec53d:
      this_03 = this_03 + 1;
    } while (this_03 != local_90);
  }
  return;
}

Assistant:

void LogicalComparisonJoin::ExtractJoinConditions(
    ClientContext &context, JoinType type, JoinRefType ref_type, unique_ptr<LogicalOperator> &left_child,
    unique_ptr<LogicalOperator> &right_child, const unordered_set<idx_t> &left_bindings,
    const unordered_set<idx_t> &right_bindings, vector<unique_ptr<Expression>> &expressions,
    vector<JoinCondition> &conditions, vector<unique_ptr<Expression>> &arbitrary_expressions) {

	for (auto &expr : expressions) {
		auto total_side = JoinSide::GetJoinSide(*expr, left_bindings, right_bindings);
		if (total_side != JoinSide::BOTH) {
			// join condition does not reference both sides, add it as filter under the join
			if ((type == JoinType::LEFT || ref_type == JoinRefType::ASOF) && total_side == JoinSide::RIGHT) {
				// filter is on RHS and the join is a LEFT OUTER join, we can push it in the right child
				if (right_child->type != LogicalOperatorType::LOGICAL_FILTER) {
					// not a filter yet, push a new empty filter
					auto filter = make_uniq<LogicalFilter>();
					filter->AddChild(std::move(right_child));
					right_child = std::move(filter);
				}
				// push the expression into the filter
				auto &filter = right_child->Cast<LogicalFilter>();
				filter.expressions.push_back(std::move(expr));
				continue;
			}
			// if the join is a LEFT JOIN and the join expression constantly evaluates to TRUE,
			// then we do not add it to the arbitrary expressions
			if (type == JoinType::LEFT && expr->IsFoldable()) {
				Value result;
				ExpressionExecutor::TryEvaluateScalar(context, *expr, result);
				if (!result.IsNull() && result == Value(true)) {
					continue;
				}
			}
		} else if (expr->GetExpressionType() == ExpressionType::COMPARE_EQUAL ||
		           expr->GetExpressionType() == ExpressionType::COMPARE_NOTEQUAL ||
		           expr->GetExpressionType() == ExpressionType::COMPARE_BOUNDARY_START ||
		           expr->GetExpressionType() == ExpressionType::COMPARE_LESSTHAN ||
		           expr->GetExpressionType() == ExpressionType::COMPARE_GREATERTHAN ||
		           expr->GetExpressionType() == ExpressionType::COMPARE_LESSTHANOREQUALTO ||
		           expr->GetExpressionType() == ExpressionType::COMPARE_GREATERTHANOREQUALTO ||
		           expr->GetExpressionType() == ExpressionType::COMPARE_BOUNDARY_START ||
		           expr->GetExpressionType() == ExpressionType::COMPARE_NOT_DISTINCT_FROM ||
		           expr->GetExpressionType() == ExpressionType::COMPARE_DISTINCT_FROM)

		{
			// comparison, check if we can create a comparison JoinCondition
			if (IsJoinTypeCondition(ref_type, expr->GetExpressionType()) &&
			    CreateJoinCondition(*expr, left_bindings, right_bindings, conditions)) {
				// successfully created the join condition
				continue;
			}
		}
		arbitrary_expressions.push_back(std::move(expr));
	}
}